

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCAtomTypesSectionParser.cpp
# Opt level: O2

void __thiscall
OpenMD::SCAtomTypesSectionParser::parseLine
          (SCAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  AtomType *pAVar2;
  RealType RVar3;
  SuttonChenAdapter sca;
  string atomTypeName;
  StringTokenizer tokenizer;
  SuttonChenAdapter local_c0;
  string local_b8;
  RealType local_98;
  RealType local_90;
  RealType local_88;
  RealType local_80;
  StringTokenizer local_78;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8," ;\t\n\r",(allocator<char> *)&local_c0);
  StringTokenizer::StringTokenizer(&local_78,line,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 6) {
    snprintf(painCave.errMsg,2000,"SCAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_b8,&local_78);
    pAVar2 = ForceField::getAtomType(ff,&local_b8);
    if (pAVar2 == (AtomType *)0x0) {
      snprintf(painCave.errMsg,2000,
               "SCAtomTypesSectionParser Error: Atom Type [%s] is not created yet\n",
               local_b8._M_dataplus._M_p);
      painCave.isFatal = 1;
      simError();
    }
    else {
      local_c0.at_ = pAVar2;
      local_80 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_88 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_90 = StringTokenizer::nextTokenAsDouble(&local_78);
      local_98 = StringTokenizer::nextTokenAsDouble(&local_78);
      RVar3 = StringTokenizer::nextTokenAsDouble(&local_78);
      SuttonChenAdapter::makeSuttonChen
                (&local_c0,local_88,local_90,local_98,
                 RVar3 * (this->options_->DistanceUnitScaling).data_,
                 local_80 * (this->options_->MetallicEnergyUnitScaling).data_);
    }
    std::__cxx11::string::~string((string *)&local_b8);
  }
  StringTokenizer::~StringTokenizer(&local_78);
  return;
}

Assistant:

void SCAtomTypesSectionParser::parseLine(ForceField& ff,
                                           const std::string& line,
                                           int lineNo) {
    StringTokenizer tokenizer(line);
    int nTokens = tokenizer.countTokens();

    // in SCAtomTypesSectionParser, a line at least contains 6 tokens
    // atomTypeName, epsilon,c,m,n and alpha
    if (nTokens < 6) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SCAtomTypesSectionParser Error: Not enough tokens at line %d\n",
               lineNo);
      painCave.isFatal = 1;
      simError();
    } else {
      std::string atomTypeName = tokenizer.nextToken();
      AtomType* atomType       = ff.getAtomType(atomTypeName);

      if (atomType != NULL) {
        SuttonChenAdapter sca = SuttonChenAdapter(atomType);

        RealType epsilon = tokenizer.nextTokenAsDouble();
        RealType c       = tokenizer.nextTokenAsDouble();
        RealType m       = tokenizer.nextTokenAsDouble();
        RealType n       = tokenizer.nextTokenAsDouble();
        RealType alpha   = tokenizer.nextTokenAsDouble();

        epsilon *= options_.getMetallicEnergyUnitScaling();
        alpha *= options_.getDistanceUnitScaling();

        sca.makeSuttonChen(c, m, n, alpha, epsilon);

      } else {
        snprintf(
            painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
            "SCAtomTypesSectionParser Error: Atom Type [%s] is not created "
            "yet\n",
            atomTypeName.c_str());
        painCave.isFatal = 1;
        simError();
      }
    }
  }